

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

char * __thiscall MeCab::whatlog::str(whatlog *this)

{
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->str_,(string *)local_30);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0]);
  }
  return (this->str_)._M_dataplus._M_p;
}

Assistant:

const char *str() {
    str_ = stream_.str();
    return str_.c_str();
  }